

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalReserve(RepeatedPtrFieldBase *this,int n)

{
  int iVar1;
  void **ppvVar2;
  Rep *pRVar3;
  RepeatedPtrFieldBase *pRVar4;
  int extend_amount;
  
  iVar1 = this->capacity_proxy_ + 1;
  extend_amount = n - iVar1;
  if (extend_amount != 0 && iVar1 <= n) {
    ppvVar2 = InternalExtend(this,extend_amount);
    return ppvVar2;
  }
  pRVar4 = this;
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar3 = rep(this);
    pRVar4 = (RepeatedPtrFieldBase *)pRVar3->elements;
  }
  return &pRVar4->tagged_rep_or_elem_ + this->current_size_;
}

Assistant:

inline void** InternalReserve(int n) {
    if (n <= Capacity()) {
      void** elements = using_sso() ? &tagged_rep_or_elem_ : rep()->elements;
      return elements + current_size_;
    }
    return InternalExtend(n - Capacity());
  }